

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

int Cudd_ApaPrintHex(FILE *fp,int digits,DdApaNumber number)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)digits;
  if (digits < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return 1;
    }
    iVar1 = fprintf((FILE *)fp,"%08x",(ulong)number[uVar2]);
    uVar2 = uVar2 + 1;
  } while (iVar1 != -1);
  return 0;
}

Assistant:

int
Cudd_ApaPrintHex(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;

    for (i = 0; i < digits; i++) {
        result = fprintf(fp,DD_APA_HEXPRINT,number[i]);
        if (result == EOF)
            return(0);
    }
    return(1);

}